

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbase64.h
# Opt level: O1

int base64_encode(uint8_t *dst,uint8_t *src,size_t *dst_len,size_t *src_len,int mode)

{
  uint8_t *puVar1;
  uint uVar2;
  char *in_RAX;
  undefined7 uVar3;
  uint8_t *dst_base;
  ulong uVar4;
  
  if (dst_len != (size_t *)0x0) {
    uVar4 = *dst_len;
    uVar2 = (uint)src_len & 0xffffff1f;
    if (((ulong)src_len & 0xffffff1f) == 0) {
      in_RAX = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
    }
    else {
      if (uVar2 != 1) goto LAB_00134064;
      in_RAX = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_";
    }
    for (; 2 < uVar4; uVar4 = uVar4 - 3) {
      *dst = in_RAX[*src >> 2];
      dst[1] = in_RAX[(uint)(src[1] >> 4) | (*src & 3) << 4];
      dst[2] = in_RAX[(uint)(src[2] >> 6) + (src[1] & 0xf) * 4];
      dst[3] = in_RAX[src[2] & 0x3f];
      dst = dst + 4;
      src = src + 3;
    }
    uVar3 = (undefined7)((ulong)in_RAX >> 8);
    if (uVar4 == 1) {
      *dst = in_RAX[*src >> 2];
      puVar1 = (uint8_t *)(in_RAX + ((*src & 3) << 4));
      in_RAX = (char *)CONCAT71(uVar3,*puVar1);
      dst[1] = *puVar1;
      if ((char)src_len < '\0') {
        dst[2] = '=';
LAB_0013405d:
        dst[3] = '=';
      }
    }
    else if (uVar4 == 2) {
      *dst = in_RAX[*src >> 2];
      dst[1] = in_RAX[(uint)(src[1] >> 4) | (*src & 3) << 4];
      puVar1 = (uint8_t *)(in_RAX + (ulong)(src[1] & 0xf) * 4);
      in_RAX = (char *)CONCAT71(uVar3,*puVar1);
      dst[2] = *puVar1;
      if ((char)src_len < '\0') goto LAB_0013405d;
    }
  }
  uVar2 = (uint)in_RAX;
  uVar4 = 0;
LAB_00134064:
  if (dst_len != (size_t *)0x0) {
    *dst_len = *dst_len - uVar4;
  }
  return uVar2;
}

Assistant:

static inline int base64_encode(uint8_t *dst, const uint8_t *src, size_t *dst_len, size_t *src_len, int mode)
{
    const uint8_t *rfc4648_alphabet            = (const uint8_t *)
        "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
    const uint8_t *url_alphabet                = (const uint8_t *)
        "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_";

    const uint8_t *T;
    uint8_t *dst_base = dst;
    int pad = mode & base64_enc_modifier_padding;
    size_t len = 0;
    int ret = BASE64_EMODE;

    if (!src_len) {
        ret = BASE64_EARGS;
        goto done;
    }
    len = *src_len;
    mode = mode & ~base64_modifier_mask;
    switch (mode) {
    case base64_mode_rfc4648:
        T = rfc4648_alphabet;
        break;
    case base64_mode_url:
        T = url_alphabet;
        break;
    default:
        /* Invalid mode. */
        goto done;
    }

    ret = BASE64_EOK;

    /* Encodes 4 destination bytes from 3 source bytes. */
    while (len >= 3) {
        dst[0] = T[((src[0] >> 2))];
        dst[1] = T[((src[0] << 4) & 0x30) | (src[1] >> 4)];
        dst[2] = T[((src[1] << 2) & 0x3c) | (src[2] >> 6)];
        dst[3] = T[((src[2] & 0x3f))];
        len -= 3;
        dst += 4;
        src += 3;
    }
    /* Encodes 8 destination bytes from 1 to 4 source bytes, if any. */
    switch(len) {
    case 2:
        dst[0] = T[((src[0] >> 2))];
        dst[1] = T[((src[0] << 4) & 0x30) | (src[1] >> 4)];
        dst[2] = T[((src[1] << 2) & 0x3c)];
        dst += 3;
        if (pad) {
            *dst++ = '=';
        }
        break;
    case 1:
        dst[0] = T[((src[0] >> 2))];
        dst[1] = T[((src[0] << 4) & 0x30)];
        dst += 2;
        if (pad) {
            *dst++ = '=';
            *dst++ = '=';
        }
        break;
    default:
        pad = 0;
        break;
    }
    len = 0;
done:
    if (dst_len) {
        *dst_len = (size_t)(dst - dst_base);
    }
    if (src_len) {
        *src_len -= len;
    }
    return ret;
}